

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O2

void WebPUtilClearPic(WebPPicture *picture,FrameRectangle *rect)

{
  if (rect != (FrameRectangle *)0x0) {
    ClearRectangle(picture,rect->x_offset_,rect->y_offset_,rect->width_,rect->height_);
    return;
  }
  ClearRectangle(picture,0,0,picture->width,picture->height);
  return;
}

Assistant:

static void WebPUtilClearPic(WebPPicture* const picture,
                             const FrameRectangle* const rect) {
  if (rect != NULL) {
    ClearRectangle(picture, rect->x_offset_, rect->y_offset_,
                   rect->width_, rect->height_);
  } else {
    ClearRectangle(picture, 0, 0, picture->width, picture->height);
  }
}